

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GetTexDataAsAlpha8
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  bool bVar1;
  int *out_bytes_per_pixel_local;
  int *out_height_local;
  int *out_width_local;
  uchar **out_pixels_local;
  ImFontAtlas *this_local;
  
  if (this->TexPixelsAlpha8 == (uchar *)0x0) {
    bVar1 = ImVector<ImFontConfig>::empty(&this->ConfigData);
    if (bVar1) {
      AddFontDefault(this,(ImFontConfig *)0x0);
    }
    Build(this);
  }
  *out_pixels = this->TexPixelsAlpha8;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 1;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsAlpha8(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Build atlas on demand
    if (TexPixelsAlpha8 == NULL)
    {
        if (ConfigData.empty())
            AddFontDefault();
        Build();
    }

    *out_pixels = TexPixelsAlpha8;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 1;
}